

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O2

int __thiscall crnlib::pixel_packer::init(pixel_packer *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint in_ECX;
  uint uVar2;
  uint in_EDX;
  uint uVar3;
  char in_R8B;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  this->m_comp_max[1] = 0;
  this->m_comp_max[2] = 0;
  *(undefined8 *)(this->m_comp_max + 3) = 0;
  this->m_comp_ofs[2] = 0;
  this->m_comp_ofs[3] = 0;
  this->m_comp_max[0] = 0;
  this->m_comp_max[1] = 0;
  this->m_comp_size[2] = 0;
  this->m_comp_size[3] = 0;
  this->m_comp_ofs[0] = 0;
  this->m_comp_ofs[1] = 0;
  this->m_pixel_stride = 0;
  this->m_num_comps = 0;
  this->m_comp_size[0] = 0;
  this->m_comp_size[1] = 0;
  uVar2 = (int)ctx - 1;
  bVar6 = uVar2 < 4;
  uVar1 = in_EDX - 1;
  if (uVar1 < 0x20 && bVar6) {
    for (uVar5 = 0; uVar5 != ((ulong)ctx & 0xffffffff); uVar5 = uVar5 + 1) {
      this->m_comp_size[uVar5] = in_EDX;
      uVar3 = (uint)uVar5;
      if (in_R8B != '\0') {
        uVar3 = uVar2;
      }
      this->m_comp_ofs[uVar5] = uVar3 * in_EDX;
      uVar2 = uVar2 - 1;
    }
    for (lVar4 = 10; lVar4 != 0xe; lVar4 = lVar4 + 1) {
      this->m_comp_size[lVar4 + -2] = ~(uint)(-1L << ((byte)this->m_comp_size[lVar4 + -10] & 0x3f));
    }
    uVar2 = in_EDX * (int)ctx + 7 >> 3;
    if (-1 < (int)in_ECX) {
      uVar2 = in_ECX;
    }
    this->m_pixel_stride = uVar2;
  }
  return CONCAT31((int3)(uVar1 >> 8),uVar1 < 0x20 && bVar6);
}

Assistant:

bool init(uint num_comps, uint bits_per_comp, int pixel_stride = -1, bool reversed = false)
        {
            clear();

            if ((num_comps < 1) || (num_comps > 4) || (bits_per_comp < 1) || (bits_per_comp > 32))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            for (uint i = 0; i < num_comps; i++)
            {
                m_comp_size[i] = bits_per_comp;
                m_comp_ofs[i] = i * bits_per_comp;
                if (reversed)
                {
                    m_comp_ofs[i] = ((num_comps - 1) * bits_per_comp) - m_comp_ofs[i];
                }
            }

            for (uint i = 0; i < 4; i++)
            {
                m_comp_max[i] = static_cast<uint32>((1ULL << m_comp_size[i]) - 1ULL);
            }

            m_pixel_stride = (pixel_stride >= 0) ? pixel_stride : (num_comps * bits_per_comp + 7) / 8;

            return true;
        }